

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTxOut::ConfidentialTxOut
          (ConfidentialTxOut *this,ConfidentialAssetId *asset,Amount *amount)

{
  AbstractTxOut::AbstractTxOut(&this->super_AbstractTxOut);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialTxOut_005cc928;
  ConfidentialAssetId::ConfidentialAssetId(&this->asset_,asset);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,amount);
  ConfidentialNonce::ConfidentialNonce(&this->nonce_);
  ByteData::ByteData(&this->surjection_proof_);
  ByteData::ByteData(&this->range_proof_);
  return;
}

Assistant:

ConfidentialTxOut::ConfidentialTxOut(
    const ConfidentialAssetId &asset, const Amount &amount)
    : AbstractTxOut(),
      asset_(asset),
      confidential_value_(ConfidentialValue(amount)),
      nonce_(),
      surjection_proof_(),
      range_proof_() {
  // do nothing
}